

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar32 u_unescapeAt_63(UNESCAPE_CHAR_AT charAt,int32_t *offset,int32_t length,void *context)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  UChar UVar4;
  UChar UVar5;
  uint uVar6;
  UChar32 UVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  undefined8 unaff_R15;
  undefined7 uVar14;
  bool bVar15;
  int32_t ahead;
  uint local_58;
  sbyte local_44;
  int local_40;
  undefined4 local_3c;
  ulong local_38;
  
  uVar6 = *offset;
  local_38 = (ulong)uVar6;
  if (length <= (int)uVar6 || (int)uVar6 < 0) goto LAB_002f5ea8;
  *offset = uVar6 + 1;
  UVar4 = (*charAt)(uVar6,context);
  uVar6 = (uint)(ushort)UVar4;
  uVar14 = (undefined7)((ulong)unaff_R15 >> 8);
  local_3c = (undefined4)CONCAT71(uVar14,1);
  local_44 = 4;
  if (UVar4 == L'x') {
    local_58 = 2;
    uVar9 = 1;
    if (length <= *offset) goto LAB_002f5cde;
    UVar5 = (*charAt)(*offset,context);
    if (UVar5 == L'{') {
      *offset = *offset + 1;
      local_58 = 8;
      local_3c = 0;
    }
    bVar2 = false;
    uVar12 = 0;
    bVar10 = false;
    bVar15 = false;
    uVar9 = 1;
  }
  else {
    if (uVar6 == 0x75) {
      uVar9 = 4;
      local_58 = 4;
    }
    else {
      if (uVar6 != 0x55) {
        uVar12 = 0xff;
        if ((UVar4 & 0xfff8U) == 0x30) {
          uVar12 = (ushort)UVar4 - 0x30 & 0xff;
        }
        bVar15 = (char)uVar12 < '\0';
        if (bVar15) {
          uVar12 = 0;
          local_58 = 0;
          local_44 = 4;
        }
        else {
          local_58 = 3;
          local_44 = 3;
        }
        bVar2 = !bVar15;
        uVar9 = (uint)!bVar15;
        bVar10 = !bVar15;
        local_3c = (undefined4)CONCAT71(uVar14,1);
        goto LAB_002f5d20;
      }
      uVar9 = 8;
      local_58 = 8;
    }
LAB_002f5cde:
    uVar12 = 0;
    bVar10 = false;
    bVar15 = false;
    bVar2 = false;
  }
LAB_002f5d20:
  if (bVar15) {
    uVar8 = 0;
    do {
      if (UVar4 == L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar8]) {
        return (uint)(ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar8 + 1];
      }
    } while (((ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[uVar8] <= (ushort)UVar4) &&
            (bVar15 = uVar8 < 0xe, uVar8 = uVar8 + 2, bVar15));
    if ((UVar4 == L'c') && (iVar11 = *offset, iVar11 < length)) {
      *offset = iVar11 + 1;
      UVar4 = (*charAt)(iVar11,context);
      uVar6 = (uint)(ushort)UVar4;
      if (((UVar4 & 0xfc00U) == 0xd800) && (*offset < length)) {
        UVar4 = (*charAt)(*offset,context);
        if ((UVar4 & 0xfc00U) == 0xdc00) {
          *offset = *offset + 1;
          uVar6 = (ushort)UVar4 + 0x2400;
        }
      }
      return uVar6 & 0x1f;
    }
    if ((UVar4 & 0xfc00U) != 0xd800) {
      return uVar6;
    }
    if (length <= *offset) {
      return uVar6;
    }
    UVar4 = (*charAt)(*offset,context);
    if (((ushort)UVar4 & 0xfc00) != 0xdc00) {
      return uVar6;
    }
    *offset = *offset + 1;
    return uVar6 * 0x400 + (uint)(ushort)UVar4 + -0x35fdc00;
  }
  iVar11 = *offset;
  uVar13 = (uint)bVar10;
  if (bVar10 < local_58 && iVar11 < length) {
    uVar6 = (uint)(byte)(bVar10 + 1);
    while( true ) {
      UVar4 = (*charAt)(iVar11,context);
      cVar1 = (char)UVar4;
      if (bVar2) {
        bVar3 = cVar1 - 0x30;
        if ((UVar4 & 0xfff8U) != 0x30) {
          bVar3 = 0xff;
        }
      }
      else if ((ushort)(UVar4 + L'￐') < 10) {
        bVar3 = cVar1 - 0x30;
      }
      else if ((ushort)(UVar4 + L'﾿') < 6) {
        bVar3 = cVar1 - 0x37;
      }
      else {
        bVar3 = 0xff;
        if ((ushort)(UVar4 + L'ﾟ') < 6) {
          bVar3 = cVar1 + 0xa9;
        }
      }
      if ((char)bVar3 < '\0') break;
      uVar12 = uVar12 << local_44 | (uint)bVar3;
      iVar11 = *offset + 1;
      *offset = iVar11;
      uVar13 = (uint)(char)uVar6;
      if ((length <= iVar11) || (uVar6 = uVar13 + 1, (int)local_58 <= (int)uVar13)) break;
    }
  }
  uVar6 = (uint)local_38;
  if ((int)uVar9 <= (int)uVar13) {
    if ((char)local_3c == '\0') {
      if (UVar4 != L'}') goto LAB_002f5ea8;
      *offset = *offset + 1;
    }
    if (uVar12 < 0x110000) {
      iVar11 = *offset;
      if (length <= iVar11) {
        return uVar12;
      }
      if ((uVar12 & 0x1ffc00) != 0xd800) {
        return uVar12;
      }
      local_40 = iVar11 + 1;
      UVar4 = (*charAt)(iVar11,context);
      if (iVar11 + 1 < length && UVar4 == L'\\') {
        UVar7 = u_unescapeAt_63(charAt,&local_40,length,context);
        UVar4 = (UChar)UVar7;
      }
      if (((ushort)UVar4 & 0xfc00) != 0xdc00) {
        return uVar12;
      }
      *offset = local_40;
      return uVar12 * 0x400 + (uint)(ushort)UVar4 + -0x35fdc00;
    }
  }
LAB_002f5ea8:
  *offset = uVar6;
  return -1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_unescapeAt(UNESCAPE_CHAR_AT charAt,
             int32_t *offset,
             int32_t length,
             void *context) {

    int32_t start = *offset;
    UChar c;
    UChar32 result = 0;
    int8_t n = 0;
    int8_t minDig = 0;
    int8_t maxDig = 0;
    int8_t bitsPerDigit = 4; 
    int8_t dig;
    int32_t i;
    UBool braces = FALSE;

    /* Check that offset is in range */
    if (*offset < 0 || *offset >= length) {
        goto err;
    }

    /* Fetch first UChar after '\\' */
    c = charAt((*offset)++, context);

    /* Convert hexadecimal and octal escapes */
    switch (c) {
    case 0x0075 /*'u'*/:
        minDig = maxDig = 4;
        break;
    case 0x0055 /*'U'*/:
        minDig = maxDig = 8;
        break;
    case 0x0078 /*'x'*/:
        minDig = 1;
        if (*offset < length && charAt(*offset, context) == 0x7B /*{*/) {
            ++(*offset);
            braces = TRUE;
            maxDig = 8;
        } else {
            maxDig = 2;
        }
        break;
    default:
        dig = _digit8(c);
        if (dig >= 0) {
            minDig = 1;
            maxDig = 3;
            n = 1; /* Already have first octal digit */
            bitsPerDigit = 3;
            result = dig;
        }
        break;
    }
    if (minDig != 0) {
        while (*offset < length && n < maxDig) {
            c = charAt(*offset, context);
            dig = (int8_t)((bitsPerDigit == 3) ? _digit8(c) : _digit16(c));
            if (dig < 0) {
                break;
            }
            result = (result << bitsPerDigit) | dig;
            ++(*offset);
            ++n;
        }
        if (n < minDig) {
            goto err;
        }
        if (braces) {
            if (c != 0x7D /*}*/) {
                goto err;
            }
            ++(*offset);
        }
        if (result < 0 || result >= 0x110000) {
            goto err;
        }
        /* If an escape sequence specifies a lead surrogate, see if
         * there is a trail surrogate after it, either as an escape or
         * as a literal.  If so, join them up into a supplementary.
         */
        if (*offset < length && U16_IS_LEAD(result)) {
            int32_t ahead = *offset + 1;
            c = charAt(*offset, context);
            if (c == 0x5C /*'\\'*/ && ahead < length) {
                c = (UChar) u_unescapeAt(charAt, &ahead, length, context);
            }
            if (U16_IS_TRAIL(c)) {
                *offset = ahead;
                result = U16_GET_SUPPLEMENTARY(result, c);
            }
        }
        return result;
    }

    /* Convert C-style escapes in table */
    for (i=0; i<UNESCAPE_MAP_LENGTH; i+=2) {
        if (c == UNESCAPE_MAP[i]) {
            return UNESCAPE_MAP[i+1];
        } else if (c < UNESCAPE_MAP[i]) {
            break;
        }
    }

    /* Map \cX to control-X: X & 0x1F */
    if (c == 0x0063 /*'c'*/ && *offset < length) {
        c = charAt((*offset)++, context);
        if (U16_IS_LEAD(c) && *offset < length) {
            UChar c2 = charAt(*offset, context);
            if (U16_IS_TRAIL(c2)) {
                ++(*offset);
                c = (UChar) U16_GET_SUPPLEMENTARY(c, c2); /* [sic] */
            }
        }
        return 0x1F & c;
    }

    /* If no special forms are recognized, then consider
     * the backslash to generically escape the next character.
     * Deal with surrogate pairs. */
    if (U16_IS_LEAD(c) && *offset < length) {
        UChar c2 = charAt(*offset, context);
        if (U16_IS_TRAIL(c2)) {
            ++(*offset);
            return U16_GET_SUPPLEMENTARY(c, c2);
        }
    }
    return c;

 err:
    /* Invalid escape sequence */
    *offset = start; /* Reset to initial value */
    return (UChar32)0xFFFFFFFF;
}